

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
               (basic_string_view<char> format_str,
               format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *handler)

{
  internal *this;
  internal *end;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *in_RCX;
  internal *first;
  char *pcVar1;
  internal *last;
  null_terminating_iterator<char> nVar2;
  iterator iVar3;
  writer write;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_40;
  writer local_38;
  
  first = (internal *)format_str.data_;
  last = first + format_str.size_;
  local_38.handler_ = handler;
  while( true ) {
    while( true ) {
      local_40 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)CONCAT71(local_40._1_7_,0x7b);
      end = (internal *)find<false,char_const*,char>((char *)first,(char *)last,(char *)&local_40);
      if (end == last) {
        parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
        ::writer::operator()(&local_38,(char *)first,(char *)last);
        return;
      }
      parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
      ::writer::operator()(&local_38,(char *)first,(char *)end);
      this = end + 1;
      if ((this == last) || (*this != (internal)0x7b)) break;
      first = end + 2;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(handler,(char *)this,(char *)first);
    }
    nVar2.end_ = (char *)&local_40;
    nVar2.ptr_ = (char *)last;
    local_40 = handler;
    nVar2 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                      (this,nVar2,in_RCX);
    iVar3.end_ = nVar2.end_;
    pcVar1 = nVar2.ptr_;
    if (pcVar1 == iVar3.end_) break;
    if (*pcVar1 == ':') {
      iVar3.ptr_ = pcVar1 + 1;
      iVar3 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::on_format_specs(handler,iVar3);
      pcVar1 = iVar3.ptr_;
      if ((pcVar1 == iVar3.end_) || (*pcVar1 != '}')) {
        pcVar1 = "unknown format specifier";
        goto LAB_0012c5f0;
      }
    }
    else {
      if (*pcVar1 != '}') break;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field(handler,nVar2);
    }
    first = (internal *)(pcVar1 + 1);
  }
  pcVar1 = "missing \'}\' in format string";
LAB_0012c5f0:
  error_handler::on_error((error_handler *)handler,pcVar1);
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      for (;;) {
        auto p = find<IS_CONSTEXPR>(begin, end, '}');
        if (p == end) {
          handler_.on_text(begin, end);
          return;
        }
        ++p;
        if (p == end || *p != '}') {
          handler_.on_error("unmatched '}' in format string");
          return;
        }
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  for (;;) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on long format strings.
    auto p = find<IS_CONSTEXPR>(begin, end, '{');
    if (p == end) {
      write(begin, end);
      return;
    }
    write(begin, p);
    ++p;
    if (p != end && *p == '{') {
      handler.on_text(p, p + 1);
      begin = p + 1;
      continue;
    }

    internal::null_terminating_iterator<Char> it(p, end);
    it = parse_arg_id(it, id_adapter<Handler, Char>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }
    begin = pointer_from(it) + 1;
  }
}